

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

DescriptorProto_ExtensionRange *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ExtensionRange>
          (Arena *arena)

{
  DescriptorProto_ExtensionRange *this;
  
  if (arena == (Arena *)0x0) {
    this = (DescriptorProto_ExtensionRange *)operator_new(0x28);
    DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange(this);
  }
  else {
    if (*(long *)(arena + 0x70) != 0) {
      OnArenaAllocation(arena,(type_info *)&DescriptorProto_ExtensionRange::typeinfo,0x28);
    }
    this = (DescriptorProto_ExtensionRange *)
           internal::ArenaImpl::AllocateAligned((ArenaImpl *)arena,0x28);
    DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange(this,arena);
  }
  return this;
}

Assistant:

static void InitDefaultsscc_info_SourceCodeInfo_google_2fprotobuf_2fdescriptor_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_SourceCodeInfo_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::SourceCodeInfo();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::SourceCodeInfo::InitAsDefaultInstance();
}